

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testConsumeSubQuery(void)

{
  FILE *__stream;
  bool bVar1;
  undefined1 local_88 [8];
  string subQuery;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  TokenQueue tokenQueue;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ol, ol > li + li",&local_51);
  crawler::TokenQueue::TokenQueue((TokenQueue *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  crawler::TokenQueue::consumeSubQuery_abi_cxx11_((string *)local_88,(TokenQueue *)local_30);
  test_count = test_count + 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,"ol");
  __stream = _stderr;
  if (bVar1) {
    test_pass = test_pass + 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"ol");
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testConsumeSubQuery",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x101,"true == (subQuery == \"ol\")",1,(uint)bVar1);
    main_ret = 1;
  }
  std::__cxx11::string::~string((string *)local_88);
  crawler::TokenQueue::~TokenQueue((TokenQueue *)local_30);
  return;
}

Assistant:

void testConsumeSubQuery() {
  crawler::TokenQueue tokenQueue("ol, ol > li + li");
  const std::string subQuery = tokenQueue.consumeSubQuery();
  ASSERT_TRUE(subQuery == "ol");
}